

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

int __thiscall f8n::db::Connection::Execute(Connection *this,char *sql)

{
  int iVar1;
  int error;
  undefined1 local_38 [8];
  unique_lock<std::mutex> lock;
  sqlite3_stmt *stmt;
  char *sql_local;
  Connection *this_local;
  
  lock._M_owns = false;
  lock._9_7_ = 0;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_38,&this->mutex);
  iVar1 = sqlite3_prepare_v2(this->connection,sql,-1,(sqlite3_stmt **)&lock._M_owns,(char **)0x0);
  if (iVar1 != 0) {
    sqlite3_finalize((sqlite3_stmt *)lock._8_8_);
    this_local._4_4_ = 1;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_38);
  if (iVar1 == 0) {
    iVar1 = StepStatement(this,(sqlite3_stmt *)lock._8_8_);
    if ((iVar1 == 0) || (iVar1 == 0x65)) {
      sqlite3_reset((sqlite3_stmt *)lock._8_8_);
      sqlite3_finalize((sqlite3_stmt *)lock._8_8_);
      this_local._4_4_ = 0;
    }
    else {
      sqlite3_finalize((sqlite3_stmt *)lock._8_8_);
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Connection::Execute(const char* sql) {
    sqlite3_stmt *stmt  = nullptr;

    /* prepare seems to give errors when interrupted */
    {
        std::unique_lock<std::mutex> lock(this->mutex);

        if (sqlite3_prepare_v2(this->connection, sql, -1, &stmt, nullptr) != SQLITE_OK) {
            sqlite3_finalize(stmt);
            return Error;
        }
    }

    int error = this->StepStatement(stmt);
    if (error != SQLITE_OK && error != SQLITE_DONE) {
        sqlite3_finalize(stmt);
        return Error;
    }

    sqlite3_reset(stmt);
    sqlite3_finalize(stmt);

    return Okay;
}